

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg.c
# Opt level: O1

reg_t * reg_get_by_id(int id,int ver)

{
  int iVar1;
  bool bVar2;
  reg_t *prVar3;
  reg_t *prVar4;
  list_t *plVar5;
  
  if (((uint)ver < 9) && ((0x19cU >> (ver & 0x1fU) & 1) != 0)) {
    prVar4 = regs_v2_v3_v4_v7_v8;
    bVar2 = false;
  }
  else {
    bVar2 = true;
    prVar4 = (reg_t *)0x0;
  }
  if (!bVar2) {
    iVar1 = prVar4->type;
    while (iVar1 != 0) {
      if (prVar4->id == id) {
        return prVar4;
      }
      prVar3 = prVar4 + 1;
      prVar4 = prVar4 + 1;
      iVar1 = prVar3->type;
    }
  }
  plVar5 = &regs_user;
  do {
    plVar5 = (list_t *)((list_node_t *)plVar5)->next;
    if ((list_node_t *)plVar5 == (list_node_t *)0x0) {
      return (reg_t *)0x0;
    }
  } while (((reg_t *)((list_node_t *)plVar5)->data)->id != id);
  return (reg_t *)((list_node_t *)plVar5)->data;
}

Assistant:

reg_t*
reg_get_by_id(
    int id,
    int ver
) {
    reg_t* table = reg_get_table(ver);
    if (table) {
        while(table->type) {
            if (table->id == id)
                return table;
            ++table;
        }
    }
    list_for_each(&regs_user, table) {
        if (table->id == id)
            return table;
    }
    return NULL;
}